

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rbuVfsWrite(sqlite3_file *pFile,void *zBuf,int iAmt,sqlite_int64 iOfst)

{
  uint uVar1;
  sqlite3_io_methods *psVar2;
  _func_int_sqlite3_file_ptr_int *p_Var3;
  int iVar4;
  long lVar5;
  _func_int_sqlite3_file_ptr_sqlite3_int64 *p_Var6;
  long lVar7;
  undefined4 in_register_00000014;
  sqlite3_io_methods *psVar8;
  u8 *pBuf;
  
  psVar2 = pFile[3].pMethods;
  if (psVar2 == (sqlite3_io_methods *)0x0) goto LAB_001d330d;
  if (psVar2->iVersion == 1) {
    if ((((ulong)pFile[5].pMethods & 0x80000) != 0) && ((long)psVar2[1].xShmBarrier <= iOfst)) {
      psVar2[1].xShmBarrier = (_func_void_sqlite3_file_ptr *)(iAmt + iOfst);
      goto LAB_001d330d;
    }
  }
  else if (psVar2->iVersion == 3) {
    *(int *)(*(long *)(psVar2 + 2) + -8 + (long)*(int *)&psVar2[1].xUnfetch * 8) =
         (int)(iOfst / (long)*(int *)&psVar2[2].xClose) + 1;
    return 0;
  }
  if (((ulong)pFile[5].pMethods & 8) == 0) goto LAB_001d330d;
  psVar8 = (sqlite3_io_methods *)(iAmt + iOfst);
  lVar5 = (long)psVar8 - (long)pFile[4].pMethods;
  if (lVar5 == 0 || (long)psVar8 < (long)pFile[4].pMethods) {
LAB_001d32f8:
    iVar4 = (int)lVar5;
    lVar7 = 1;
  }
  else {
    p_Var6 = psVar2[2].xTruncate + lVar5;
    psVar2[2].xTruncate = p_Var6;
    pFile[4].pMethods = psVar8;
    p_Var3 = psVar2[2].xSync;
    lVar7 = 0;
    lVar5 = 0xd;
    if ((long)p_Var6 <= (long)p_Var3 || p_Var3 == (_func_int_sqlite3_file_ptr_int *)0x0) {
      lVar5 = lVar7;
    }
    iVar4 = (int)lVar5;
    if ((long)p_Var6 <= (long)p_Var3 || p_Var3 == (_func_int_sqlite3_file_ptr_int *)0x0)
    goto LAB_001d32f8;
  }
  if ((char)lVar7 == '\0') {
    return iVar4;
  }
LAB_001d330d:
  iVar4 = (**(code **)(*(long *)pFile[1].pMethods + 0x18))
                    (pFile[1].pMethods,zBuf,CONCAT44(in_register_00000014,iAmt),iOfst);
  if ((iOfst == 0 && iVar4 == 0) && (iVar4 = 0, ((ulong)pFile[5].pMethods & 0x100) != 0)) {
    uVar1 = *(uint *)((long)zBuf + 0x18);
    *(uint *)((long)&pFile[5].pMethods + 4) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    *(undefined1 *)&pFile[6].pMethods = *(undefined1 *)((long)zBuf + 0x13);
  }
  return iVar4;
}

Assistant:

static int rbuVfsWrite(
  sqlite3_file *pFile, 
  const void *zBuf, 
  int iAmt, 
  sqlite_int64 iOfst
){
  rbu_file *p = (rbu_file*)pFile;
  sqlite3rbu *pRbu = p->pRbu;
  int rc;

  if( pRbu && pRbu->eStage==RBU_STAGE_CAPTURE ){
    assert( p->openFlags & SQLITE_OPEN_MAIN_DB );
    rc = rbuCaptureDbWrite(p->pRbu, iOfst);
  }else{
    if( pRbu ){
      if( pRbu->eStage==RBU_STAGE_OAL 
       && (p->openFlags & SQLITE_OPEN_WAL) 
       && iOfst>=pRbu->iOalSz
      ){
        pRbu->iOalSz = iAmt + iOfst;
      }else if( p->openFlags & SQLITE_OPEN_DELETEONCLOSE ){
        i64 szNew = iAmt+iOfst;
        if( szNew>p->sz ){
          rc = rbuUpdateTempSize(p, szNew);
          if( rc!=SQLITE_OK ) return rc;
        }
      }
    }
    rc = p->pReal->pMethods->xWrite(p->pReal, zBuf, iAmt, iOfst);
    if( rc==SQLITE_OK && iOfst==0 && (p->openFlags & SQLITE_OPEN_MAIN_DB) ){
      /* These look like magic numbers. But they are stable, as they are part
      ** of the definition of the SQLite file format, which may not change. */
      u8 *pBuf = (u8*)zBuf;
      p->iCookie = rbuGetU32(&pBuf[24]);
      p->iWriteVer = pBuf[19];
    }
  }
  return rc;
}